

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::RsElseClauseSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,RsElseClauseSyntax *this,size_t index)

{
  Token token;
  RsProdItemSyntax *node;
  size_t index_local;
  RsElseClauseSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->keyword).kind;
    token._2_1_ = (this->keyword).field_0x2;
    token.numFlags.raw = (this->keyword).numFlags.raw;
    token.rawLen = (this->keyword).rawLen;
    token.info = (this->keyword).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    node = not_null<slang::syntax::RsProdItemSyntax_*>::get(&this->item);
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(SyntaxNode *)node);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax RsElseClauseSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return keyword;
        case 1: return item.get();
        default: return nullptr;
    }
}